

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  GCObject *o;
  byte bVar1;
  int iVar2;
  TString **ppTVar3;
  ulong uVar4;
  BlockCnt *pBVar5;
  ulong uVar6;
  long lVar7;
  
  if (fs == (FuncState *)0x0) {
    var->t = -1;
    var->f = -1;
    var->k = VGLOBAL;
    (var->u).s.info = 0xff;
LAB_0010da3e:
    iVar2 = 8;
  }
  else {
    uVar6 = (ulong)fs->nactvar;
    do {
      uVar4 = uVar6;
      if ((long)uVar4 < 1) {
        iVar2 = singlevaraux(fs->prev,n,var,0);
        if (iVar2 == 8) goto LAB_0010da3e;
        o = (GCObject *)fs->f;
        iVar2 = (o->p).sizeupvalues;
        lVar7 = (long)iVar2;
        bVar1 = (o->p).nups;
        uVar6 = 0;
        goto LAB_0010da5d;
      }
      uVar6 = uVar4 - 1;
    } while (fs->f->locvars[*(ushort *)&fs->upvalues[uVar4 + 0x3b].info].varname != n);
    var->t = -1;
    var->f = -1;
    var->k = VLOCAL;
    (var->u).s.info = (int)(uVar4 - 1);
    iVar2 = 6;
    if (base == 0) {
      pBVar5 = (BlockCnt *)&fs->bl;
      do {
        pBVar5 = pBVar5->previous;
        if (pBVar5 == (BlockCnt *)0x0) {
          return 6;
        }
      } while ((long)uVar4 <= (long)(ulong)pBVar5->nactvar);
      pBVar5->upval = '\x01';
    }
  }
  return iVar2;
LAB_0010da5d:
  if (bVar1 == uVar6) {
    if (0x3b < bVar1) {
      errorlimit(fs,0x3c,"upvalues");
    }
    if (iVar2 <= (int)(uint)bVar1) {
      ppTVar3 = (TString **)
                luaM_growaux_(fs->L,(o->p).upvalues,&(o->p).sizeupvalues,8,0x7ffffffd,"");
      (o->p).upvalues = ppTVar3;
      iVar2 = (o->p).sizeupvalues;
    }
    for (; lVar7 < iVar2; lVar7 = lVar7 + 1) {
      (o->p).upvalues[lVar7] = (TString *)0x0;
    }
    bVar1 = (o->p).nups;
    uVar6 = (ulong)bVar1;
    (o->p).upvalues[uVar6] = n;
    if ((((n->tsv).marked & 3) != 0) && (((o->gch).marked & 4) != 0)) {
      luaC_barrierf(fs->L,o,(GCObject *)n);
      bVar1 = (o->p).nups;
      uVar6 = (ulong)bVar1;
    }
    fs->upvalues[uVar6].k = (char)var->k;
    fs->upvalues[uVar6].info = *(lu_byte *)&var->u;
    (o->p).nups = bVar1 + 1;
    uVar6 = (ulong)bVar1;
LAB_0010db17:
    (var->u).s.info = (int)uVar6;
    var->k = VUPVAL;
    return 7;
  }
  if ((var->k == (uint)fs->upvalues[uVar6].k) && ((var->u).s.info == (uint)fs->upvalues[uVar6].info)
     ) goto LAB_0010db17;
  uVar6 = uVar6 + 1;
  goto LAB_0010da5d;
}

Assistant:

static int singlevaraux(FuncState*fs,TString*n,expdesc*var,int base){
if(fs==NULL){
init_exp(var,VGLOBAL,((1<<8)-1));
return VGLOBAL;
}
else{
int v=searchvar(fs,n);
if(v>=0){
init_exp(var,VLOCAL,v);
if(!base)
markupval(fs,v);
return VLOCAL;
}
else{
if(singlevaraux(fs->prev,n,var,0)==VGLOBAL)
return VGLOBAL;
var->u.s.info=indexupvalue(fs,n,var);
var->k=VUPVAL;
return VUPVAL;
}
}
}